

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O2

void output_base(void)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  
  if (rflag == '\0') {
    fwrite("static ",7,1,(FILE *)output_file);
  }
  fprintf((FILE *)output_file,"int %ssindex[] = {%39d,",symbol_prefix,(ulong)(uint)*base);
  iVar2 = 10;
  for (lVar4 = 1; lVar4 < nstates; lVar4 = lVar4 + 1) {
    if (iVar2 < 10) {
      iVar2 = iVar2 + 1;
    }
    else {
      if (rflag == '\0') {
        outline = outline + 1;
      }
      putc(10,(FILE *)output_file);
      iVar2 = 1;
    }
    fprintf((FILE *)output_file,"%5d,",(ulong)(uint)base[lVar4]);
  }
  if (rflag == '\0') {
    outline = outline + 2;
  }
  fwrite("\n};\n",4,1,(FILE *)output_file);
  if (rflag == '\0') {
    fwrite("static ",7,1,(FILE *)output_file);
  }
  fprintf((FILE *)output_file,"int %srindex[] = {%39d,",symbol_prefix,(ulong)(uint)base[nstates]);
  iVar2 = 10;
  uVar1 = (ulong)nstates;
  uVar3 = uVar1;
  while (uVar3 = uVar3 + 1, (long)uVar3 < (long)((int)uVar1 * 2)) {
    if (iVar2 < 10) {
      iVar2 = iVar2 + 1;
    }
    else {
      if (rflag == '\0') {
        outline = outline + 1;
      }
      putc(10,(FILE *)output_file);
      iVar2 = 1;
    }
    fprintf((FILE *)output_file,"%5d,",(ulong)(uint)base[uVar3]);
    uVar1 = (ulong)(uint)nstates;
  }
  if (rflag == '\0') {
    outline = outline + 2;
  }
  fwrite("\n};\n",4,1,(FILE *)output_file);
  if (rflag == '\0') {
    fwrite("static ",7,1,(FILE *)output_file);
  }
  fprintf((FILE *)output_file,"int %scindex[] = {%39d,",symbol_prefix,
          (ulong)(uint)base[(long)nstates * 2]);
  iVar2 = 10;
  for (lVar4 = (long)(nstates * 2 + 1); lVar4 < nstates * 3; lVar4 = lVar4 + 1) {
    if (iVar2 < 10) {
      iVar2 = iVar2 + 1;
    }
    else {
      if (rflag == '\0') {
        outline = outline + 1;
      }
      putc(10,(FILE *)output_file);
      iVar2 = 1;
    }
    fprintf((FILE *)output_file,"%5d,",(ulong)(uint)base[lVar4]);
  }
  if (rflag == '\0') {
    outline = outline + 2;
  }
  fwrite("\n};\n",4,1,(FILE *)output_file);
  if (rflag == '\0') {
    fwrite("static ",7,1,(FILE *)output_file);
  }
  fprintf((FILE *)output_file,"int %sgindex[] = {%39d,",symbol_prefix,
          (ulong)(uint)base[(long)nstates * 3]);
  lVar4 = (long)(nstates * 3);
  iVar2 = 10;
  while (lVar4 = lVar4 + 1, lVar4 < (long)nvectors + -1) {
    if (iVar2 < 10) {
      iVar2 = iVar2 + 1;
    }
    else {
      if (rflag == '\0') {
        outline = outline + 1;
      }
      putc(10,(FILE *)output_file);
      iVar2 = 1;
    }
    fprintf((FILE *)output_file,"%5d,",(ulong)(uint)base[lVar4]);
  }
  if (rflag == '\0') {
    outline = outline + 2;
  }
  fwrite("\n};\n",4,1,(FILE *)output_file);
  free(base);
  return;
}

Assistant:

void output_base()
{
    register int i, j;

    if (!rflag)
	fprintf(output_file, "static ");
    fprintf(output_file, "int %ssindex[] = {%39d,", symbol_prefix, base[0]);
    j = 10;
    for (i = 1; i < nstates; i++) {
	if (j >= 10) {
	    if (!rflag) ++outline;
	    putc('\n', output_file);
	    j = 1; }
	else
	    ++j;
	fprintf(output_file, "%5d,", base[i]); }

    if (!rflag) outline += 2;
    fprintf(output_file, "\n};\n");
    if (!rflag)
	fprintf(output_file, "static ");
    fprintf(output_file, "int %srindex[] = {%39d,", symbol_prefix, base[nstates]);
    j = 10;
    for (i = nstates + 1; i < 2*nstates; i++) {
	if (j >= 10) {
	    if (!rflag) ++outline;
	    putc('\n', output_file);
	    j = 1; }
	else
	    ++j;
	fprintf(output_file, "%5d,", base[i]); }

    if (!rflag) outline += 2;
    fprintf(output_file, "\n};\n");
    if (!rflag)
	fprintf(output_file, "static ");
    fprintf(output_file, "int %scindex[] = {%39d,", symbol_prefix, base[2*nstates]);
    j = 10;
    for (i = 2*nstates + 1; i < 3*nstates; i++) {
	if (j >= 10) {
	    if (!rflag) ++outline;
	    putc('\n', output_file);
	    j = 1; }
	else
	    ++j;
	fprintf(output_file, "%5d,", base[i]); }


    if (!rflag) outline += 2;
    fprintf(output_file, "\n};\n");
    if (!rflag)
	fprintf(output_file, "static ");
    fprintf(output_file, "int %sgindex[] = {%39d,", symbol_prefix,
	    base[3*nstates]);
    j = 10;
    for (i = 3*nstates + 1; i < nvectors - 1; i++) {
	if (j >= 10) {
	    if (!rflag) ++outline;
	    putc('\n', output_file);
	    j = 1; }
	else
	    ++j;
	fprintf(output_file, "%5d,", base[i]); }

    if (!rflag) outline += 2;
    fprintf(output_file, "\n};\n");
    FREE(base);
}